

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  uchar *puVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  Mem *pMVar4;
  u8 uVar5;
  Vdbe *pVVar6;
  int nName;
  size_t sVar7;
  char *pcVar8;
  uint N;
  int nTotal;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uchar *puVar13;
  StrAccum out;
  int idx;
  int tokenType;
  Mem utf8;
  char zBase [100];
  StrAccum local_120;
  int local_100;
  int local_fc;
  long local_f8;
  Vdbe *local_f0;
  MemValue local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  sqlite3 *psStack_c0;
  undefined8 local_b8;
  sqlite3 *local_a8;
  long local_a0;
  char local_98 [104];
  
  local_100 = 0;
  psVar3 = p->db;
  local_120.mxAlloc = psVar3->aLimit[0];
  local_120.zText = local_98;
  local_120.db = (sqlite3 *)0x0;
  local_120.nAlloc = 100;
  local_120.nChar = 0;
  local_120.accError = '\0';
  local_120.printfFlags = '\0';
  if (psVar3->nVdbeExec < 2) {
    if (p->nVar == 0) {
      if (zRawSql == (char *)0x0) {
        N = 0;
      }
      else {
        sVar7 = strlen(zRawSql);
        N = (uint)sVar7 & 0x3fffffff;
      }
      sqlite3_str_append(&local_120,zRawSql,N);
    }
    else {
      local_f0 = p;
      local_a8 = psVar3;
      if (*zRawSql != '\0') {
        iVar11 = 1;
        do {
          iVar9 = 0;
          puVar13 = (uchar *)zRawSql;
          do {
            nName = sqlite3GetToken(puVar13,&local_fc);
            if (local_fc == 0x94) goto LAB_00124b0a;
            iVar9 = iVar9 + nName;
            puVar1 = puVar13 + nName;
            puVar13 = puVar13 + nName;
          } while (*puVar1 != '\0');
          nName = 0;
LAB_00124b0a:
          sqlite3_str_append(&local_120,zRawSql,iVar9);
          pVVar6 = local_f0;
          if (nName == 0) break;
          puVar13 = (uchar *)zRawSql + iVar9;
          if (*puVar13 == '?') {
            if (1 < nName) {
              sqlite3GetInt32((char *)(puVar13 + 1),&local_100);
              iVar11 = local_100;
            }
          }
          else {
            iVar11 = sqlite3VListNameToNum(local_f0->pVList,(char *)puVar13,nName);
          }
          local_100 = iVar11;
          iVar11 = local_100;
          lVar12 = (long)local_100;
          pMVar4 = pVVar6->aVar;
          uVar2 = pMVar4[lVar12 + -1].flags;
          if ((uVar2 & 1) == 0) {
            if ((uVar2 & 4) == 0) {
              if ((uVar2 & 8) == 0) {
                if ((uVar2 & 2) == 0) {
                  if ((uVar2 >> 0xe & 1) == 0) {
                    local_f8 = lVar12;
                    if (local_120.nChar + 2 < local_120.nAlloc) {
                      (local_120.zText + local_120.nChar)[0] = 'x';
                      (local_120.zText + local_120.nChar)[1] = '\'';
                      local_120.nChar = local_120.nChar + 2;
                    }
                    else {
                      enlargeAndAppend(&local_120,"x\'",2);
                    }
                    if (0 < (long)pMVar4[lVar12 + -1].n) {
                      lVar10 = 0;
                      local_a0 = (long)pMVar4[lVar12 + -1].n;
                      do {
                        sqlite3_str_appendf(&local_120,"%02x",
                                            (ulong)(byte)pMVar4[lVar12 + -1].z[lVar10]);
                        lVar10 = lVar10 + 1;
                      } while (local_a0 != lVar10);
                    }
                    if (local_120.nChar + 1 < local_120.nAlloc) {
                      local_120.zText[local_120.nChar] = '\'';
                      local_120.nChar = local_120.nChar + 1;
                    }
                    else {
                      enlargeAndAppend(&local_120,"\'",1);
                    }
                    iVar11 = (int)local_f8;
                  }
                  else {
                    sqlite3_str_appendf(&local_120,"zeroblob(%d)",
                                        (ulong)(uint)pMVar4[lVar12 + -1].u.nZero);
                  }
                }
                else if (local_a8->enc == '\x01') {
                  sqlite3_str_appendf(&local_120,"\'%.*q\'",(ulong)(uint)pMVar4[lVar12 + -1].n,
                                      pMVar4[lVar12 + -1].z);
                }
                else {
                  local_c8 = 0;
                  local_d8 = 0;
                  uStack_d0 = 0;
                  local_e8.r = 0.0;
                  uStack_e0 = 0;
                  local_b8 = 0;
                  psStack_c0 = local_a8;
                  sqlite3VdbeMemSetStr
                            ((Mem *)&local_e8,pMVar4[lVar12 + -1].z,pMVar4[lVar12 + -1].n,
                             local_a8->enc,(_func_void_void_ptr *)0x0);
                  if ((((uStack_e0 & 2) != 0) && (uStack_e0._2_1_ != '\x01')) &&
                     (iVar9 = sqlite3VdbeMemTranslate((Mem *)&local_e8,'\x01'), iVar9 == 7)) {
                    local_120.accError = 7;
                    local_120.nAlloc = 0;
                  }
                  sqlite3_str_appendf(&local_120,"\'%.*q\'",uStack_e0 >> 0x20,local_d8);
                  if (((uStack_e0 & 0x2400) != 0) || ((int)local_c8 != 0)) {
                    vdbeMemClear((Mem *)&local_e8);
                  }
                }
              }
              else {
                sqlite3_str_appendf(&local_120,"%!.15g",pMVar4[lVar12 + -1].u.nZero);
              }
            }
            else {
              sqlite3_str_appendf(&local_120,"%lld",pMVar4[lVar12 + -1].u.r);
            }
          }
          else if (local_120.nChar + 4 < local_120.nAlloc) {
            builtin_strncpy(local_120.zText + local_120.nChar,"NULL",4);
            local_120.nChar = local_120.nChar + 4;
          }
          else {
            enlargeAndAppend(&local_120,"NULL",4);
          }
          zRawSql = (char *)(puVar13 + nName);
          iVar11 = iVar11 + 1;
        } while (*zRawSql != '\0');
      }
    }
  }
  else if (*zRawSql != '\0') {
    do {
      lVar12 = 1;
      do {
        lVar10 = lVar12;
        if (zRawSql[lVar10 + -1] == '\n') break;
        lVar12 = lVar10 + 1;
      } while (zRawSql[lVar10] != '\0');
      if (local_120.nChar + 3 < local_120.nAlloc) {
        local_120.zText[(ulong)local_120.nChar + 2] = ' ';
        (local_120.zText + local_120.nChar)[0] = '-';
        (local_120.zText + local_120.nChar)[1] = '-';
        local_120.nChar = local_120.nChar + 3;
      }
      else {
        enlargeAndAppend(&local_120,"-- ",3);
      }
      sqlite3_str_append(&local_120,zRawSql,(int)lVar10);
      pcVar8 = zRawSql + lVar10;
      zRawSql = zRawSql + lVar10;
    } while (*pcVar8 != '\0');
  }
  if (local_120.accError != '\0') {
    uVar5 = local_120.printfFlags;
    if ((local_120._28_2_ & 0x400) != 0) {
      if (local_120.zText != (char *)0x0) {
        sqlite3DbFreeNN(local_120.db,local_120.zText);
      }
      local_120._28_2_ = CONCAT11(uVar5,local_120.accError) & 0xfbff;
    }
    local_120.nAlloc = 0;
    local_120.nChar = 0;
    local_120.zText = (char *)0x0;
  }
  pcVar8 = sqlite3StrAccumFinish(&local_120);
  return pcVar8;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 into UTF8 for display */
#endif
  char zBase[100];         /* Initial working space */

  db = p->db;
  sqlite3StrAccumInit(&out, 0, zBase, sizeof(zBase), 
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3_str_append(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3_str_append(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3_str_append(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3_str_append(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = idx + 1;
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3_str_append(&out, "NULL", 4);
      }else if( pVar->flags & MEM_Int ){
        sqlite3_str_appendf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3_str_appendf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = SQLITE_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif    
        sqlite3_str_appendf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3_str_appendf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3_str_append(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3_str_appendf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3_str_append(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3_str_reset(&out);
  return sqlite3StrAccumFinish(&out);
}